

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v9::detail::
     handle_dynamic_spec<fmt::v9::detail::precision_checker,fmt::v9::basic_format_context<fmt::v9::appender,char>>
               (int *value,arg_ref<char> ref,basic_format_context<fmt::v9::appender,_char> *ctx)

{
  int iVar1;
  format_arg local_68;
  format_arg local_38;
  basic_format_context<fmt::v9::appender,_char> *local_18;
  basic_format_context<fmt::v9::appender,_char> *ctx_local;
  int *value_local;
  
  if (ref.kind != none) {
    local_18 = ctx;
    ctx_local = (basic_format_context<fmt::v9::appender,_char> *)value;
    if (ref.kind == index) {
      basic_format_context<fmt::v9::appender,_char>::arg(&local_38,ctx,ref.val.index);
      basic_format_context<fmt::v9::appender,_char>::error_handler(local_18);
      iVar1 = get_dynamic_spec<fmt::v9::detail::precision_checker,fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>,fmt::v9::detail::error_handler>
                        ();
      *(int *)&(ctx_local->out_).super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
               container = iVar1;
    }
    else if (ref.kind == name) {
      basic_format_context<fmt::v9::appender,_char>::arg(&local_68,ctx,ref.val.name);
      basic_format_context<fmt::v9::appender,_char>::error_handler(local_18);
      iVar1 = get_dynamic_spec<fmt::v9::detail::precision_checker,fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>,fmt::v9::detail::error_handler>
                        ();
      *(int *)&(ctx_local->out_).super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
               container = iVar1;
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_dynamic_spec(int& value,
                                       arg_ref<typename Context::char_type> ref,
                                       Context& ctx) {
  switch (ref.kind) {
  case arg_id_kind::none:
    break;
  case arg_id_kind::index:
    value = detail::get_dynamic_spec<Handler>(ctx.arg(ref.val.index),
                                              ctx.error_handler());
    break;
  case arg_id_kind::name:
    value = detail::get_dynamic_spec<Handler>(ctx.arg(ref.val.name),
                                              ctx.error_handler());
    break;
  }
}